

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_AST.h
# Opt level: O3

bool __thiscall soul::AST::ArrayElementRef::isResolved(ArrayElementRef *this)

{
  Expression *pEVar1;
  bool bVar2;
  int iVar3;
  
  if (this->isSlice != false) {
    bVar2 = isSliceRangeValid(this);
    return bVar2;
  }
  pEVar1 = (this->object).object;
  if ((pEVar1 != (Expression *)0x0) && (pEVar1->kind == value)) {
    iVar3 = (*(pEVar1->super_Statement).super_ASTObject._vptr_ASTObject[3])();
    if (((char)iVar3 != '\0') &&
       ((pEVar1 = (this->startIndex).object, pEVar1 != (Expression *)0x0 && (pEVar1->kind == value))
       )) {
      iVar3 = (*(pEVar1->super_Statement).super_ASTObject._vptr_ASTObject[3])();
      return SUB41(iVar3,0);
    }
  }
  return false;
}

Assistant:

bool isResolved() const override
        {
            return isSlice ? isSliceRangeValid()
                           : (isResolvedAsValue (object) && isResolvedAsValue (startIndex));
        }